

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdsPATH::reset(gdsPATH *this)

{
  pointer piVar1;
  
  this->layer = 0;
  this->dataType = 0;
  this->pathtype = 0;
  this->width = 0;
  piVar1 = (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  this->propattr = 0;
  std::__cxx11::string::assign((char *)&this->propvalue);
  return;
}

Assistant:

void gdsPATH::reset()
{
  layer = 0;
  dataType = 0;
  pathtype = 0;
  width = 0;
  xCor.clear();
  yCor.clear();
  propattr = 0;
  propvalue = "\0";
}